

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed32CasesWithSizes_WriteLittleEndian32_Test::
~Fixed32CasesWithSizes_WriteLittleEndian32_Test
          (Fixed32CasesWithSizes_WriteLittleEndian32_Test *this)

{
  Fixed32CasesWithSizes_WriteLittleEndian32_Test *this_local;
  
  ~Fixed32CasesWithSizes_WriteLittleEndian32_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(Fixed32CasesWithSizes, WriteLittleEndian32) {
  Fixed32Case kFixed32Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteLittleEndian32(kFixed32Cases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(sizeof(uint32_t), coded_output.ByteCount());
  }

  EXPECT_EQ(sizeof(uint32_t), output.ByteCount());
  EXPECT_EQ(0, memcmp(buffer_, kFixed32Cases_case.bytes, sizeof(uint32_t)));
}